

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automatic.c
# Opt level: O1

void icetAutomaticCompose
               (IceTInt *compose_group,IceTInt group_size,IceTInt image_dest,
               IceTSparseImage input_image,IceTSparseImage *result_image,IceTSizeType *piece_offset)

{
  IceTEnum strategy;
  
  if (group_size < 8) {
    if (group_size < 1) {
      icetClearSparseImage(input_image);
      result_image->opaque_internals = (IceTVoid *)input_image;
      return;
    }
    strategy = 0x7003;
  }
  else {
    strategy = 0x7002;
  }
  icetInvokeSingleImageStrategy
            (strategy,compose_group,group_size,image_dest,input_image,result_image,piece_offset);
  return;
}

Assistant:

void icetAutomaticCompose(const IceTInt *compose_group,
                          IceTInt group_size,
                          IceTInt image_dest,
                          IceTSparseImage input_image,
                          IceTSparseImage *result_image,
                          IceTSizeType *piece_offset)
{
    if (group_size >= 8) {
	icetRaiseDebug("Doing bswap compose");
        icetInvokeSingleImageStrategy(ICET_SINGLE_IMAGE_STRATEGY_BSWAP,
                                      compose_group,
                                      group_size,
                                      image_dest,
                                      input_image,
                                      result_image,
                                      piece_offset);
    } else if (group_size > 0) {
	icetRaiseDebug("Doing tree compose");
        icetInvokeSingleImageStrategy(ICET_SINGLE_IMAGE_STRATEGY_TREE,
                                      compose_group,
                                      group_size,
                                      image_dest,
                                      input_image,
                                      result_image,
                                      piece_offset);
    } else {
	icetRaiseDebug("Clearing pixels");
        icetClearSparseImage(input_image);
        *result_image = input_image;
    }
}